

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::OverheadTest_SmallBlocksLargerThanInitial_Test::
~OverheadTest_SmallBlocksLargerThanInitial_Test
          (OverheadTest_SmallBlocksLargerThanInitial_Test *this)

{
  OverheadTest_SmallBlocksLargerThanInitial_Test *this_local;
  
  ~OverheadTest_SmallBlocksLargerThanInitial_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OverheadTest, SmallBlocksLargerThanInitial) {
  OverheadTest test;
  size_t initial_block_size = upb_Arena_SpaceAllocated(test.arena_, nullptr);
  for (int i = 0; i < 10; i++) {
    test.Alloc(initial_block_size * 2 + 1);
  }
  if (!UPB_ASAN && sizeof(void*) == 8) {
    EXPECT_NEAR(test.WastePct(), 0.37, 0.025);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.5, 0.025);
  }
}